

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O2

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyConstraints
          (TPZElementMatrixT<std::complex<double>_> *this)

{
  TPZStack<long,_10> *this_00;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  TPZBlock *this_01;
  TPZFNMatrix<1000,_std::complex<double>_> *this_02;
  double dVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  TNode *pTVar6;
  TPZDepend *pTVar7;
  double dVar8;
  undefined8 uVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  _Self __tmp;
  ostream *poVar13;
  _Base_ptr p_Var14;
  TPZConnect *pTVar15;
  ulong uVar16;
  ulong uVar17;
  complex<double> *pcVar18;
  complex<double> *pcVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int c;
  long lVar25;
  long lVar26;
  TPZDepend **ppTVar27;
  ulong uVar28;
  _List_node_base *p_Var29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int64_t i;
  ulong uVar35;
  long col;
  ulong local_150;
  int local_12c;
  int64_t local_128;
  set<long,_std::less<long>,_std::allocator<long>_> connectlist;
  TPZVec<int> DependenceOrder;
  set<long,_std::less<long>,_std::allocator<long>_> origlist;
  
  if ((this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow == 0) {
    poVar13 = std::operator<<((ostream *)&std::cout,"this->fMat not initialized");
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  uVar35 = (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.super_TPZVec<long>.
           fNElements;
  this_00 = &(this->super_TPZElementMatrix).fConstrConnect;
  iVar23 = (int)uVar35;
  TPZManVector<long,_10>::Resize(&this_00->super_TPZManVector<long,_10>,(long)iVar23);
  if (iVar23 != 0) {
    origlist._M_t._M_impl._0_8_ = 0;
    TPZVec<long>::Fill((TPZVec<long> *)this_00,(long *)&origlist,0,-1);
  }
  origlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &origlist._M_t._M_impl.super__Rb_tree_header._M_header;
  origlist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  origlist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  origlist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &connectlist._M_t._M_impl.super__Rb_tree_header._M_header;
  connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  connectlist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar28 = 0;
  uVar35 = uVar35 & 0xffffffff;
  if (iVar23 < 1) {
    uVar35 = uVar28;
  }
  connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  origlist._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       origlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; uVar35 * 8 != uVar28; uVar28 = uVar28 + 8) {
    std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &connectlist,
               (long *)((long)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                              super_TPZVec<long>.fStore + uVar28));
  }
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  p_Var29 = (_List_node_base *)plVar1;
  while (p_Var29 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                    &p_Var29->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var29 != (_List_node_base *)plVar1) {
    lVar32 = 0;
    for (lVar25 = 0; lVar25 < (long)p_Var29[2]._M_next; lVar25 = lVar25 + 1) {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &connectlist,(long *)((long)&(p_Var29[1]._M_prev)->_M_next + lVar32));
      lVar32 = lVar32 + 0x10;
    }
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::operator=
            (&origlist._M_t,&connectlist._M_t);
  TPZConnect::BuildConnectList(&connectlist,&origlist,(this->super_TPZElementMatrix).fMesh);
  (*(this_00->super_TPZManVector<long,_10>).super_TPZVec<long>._vptr_TPZVec[3])
            (this_00,connectlist._M_t._M_impl.super__Rb_tree_header._M_node_count);
  plVar5 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
           super_TPZVec<long>.fStore;
  p_Var14 = connectlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar35 = 0; uVar35 < connectlist._M_t._M_impl.super__Rb_tree_header._M_node_count;
      uVar35 = uVar35 + 1) {
    plVar5[uVar35] = *(long *)(p_Var14 + 1);
    p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
  }
  uVar35 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
           super_TPZVec<long>.fNElements;
  DependenceOrder._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  DependenceOrder.fStore = (int *)0x0;
  DependenceOrder.fNElements = 0;
  DependenceOrder.fNAlloc = 0;
  TPZElementMatrix::BuildDependencyOrder
            (&this->super_TPZElementMatrix,(TPZVec<long> *)this_00,&DependenceOrder,
             (this->super_TPZElementMatrix).fMesh);
  this_01 = &this->fConstrBlock;
  iVar23 = (int)uVar35;
  TPZBlock::SetNBlocks(this_01,iVar23);
  uVar30 = 0;
  uVar28 = 0;
  if (0 < iVar23) {
    uVar28 = uVar35 & 0xffffffff;
  }
  local_150 = 0;
  for (; uVar28 != uVar30; uVar30 = uVar30 + 1) {
    pTVar15 = TPZChunkVector<TPZConnect,_10>::operator[]
                        (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                          super_TPZChunkVector<TPZConnect,_10>,
                         (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                         super_TPZVec<long>.fStore[uVar30]);
    iVar12 = TPZConnect::NDof(pTVar15,(this->super_TPZElementMatrix).fMesh);
    if (iVar12 != (uint)(pTVar15->field_2).fCompose.fNState * pTVar15->fNShape) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                 ,0xbb);
    }
    TPZBlock::Set(this_01,(int)uVar30,iVar12,-1);
    local_150 = local_150 + (long)iVar12;
  }
  TPZBlock::Resequence(this_01,0);
  this_02 = &this->fConstrMat;
  (this->fConstrBlock).fpMatrix = (TPZBaseMatrix *)this_02;
  uVar30 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  uVar16 = uVar30;
  if ((this->super_TPZElementMatrix).fType == EK) {
    uVar16 = local_150;
  }
  TPZFMatrix<std::complex<double>_>::Redim
            (&this_02->super_TPZFMatrix<std::complex<double>_>,local_150,uVar16);
  uVar3 = (uint)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                super_TPZVec<long>.fNElements;
  uVar22 = 0;
  uVar16 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar16 = uVar22;
  }
  if ((long)uVar30 < 1) {
    uVar30 = uVar22;
  }
  for (; uVar22 != uVar16; uVar22 = uVar22 + 1) {
    for (uVar17 = 0;
        (uVar24 = uVar28, uVar28 != uVar17 &&
        (uVar24 = uVar17,
        (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
        super_TPZVec<long>.fStore[uVar17] !=
        (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.super_TPZVec<long>.
        fStore[uVar22])); uVar17 = uVar17 + 1) {
    }
    pTVar6 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    lVar32 = (long)pTVar6[uVar22].pos;
    lVar25 = pTVar6[uVar22].dim + lVar32;
    local_128 = (int64_t)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar24].
                         pos;
    if ((this->super_TPZElementMatrix).fType == EF) {
      for (; lVar32 < lVar25; lVar32 = lVar32 + 1) {
        for (uVar17 = 0; uVar30 != uVar17; uVar17 = uVar17 + 1) {
          pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                              (&(this->fMat).super_TPZFMatrix<std::complex<double>_>,lVar32,uVar17);
          pcVar19 = TPZFMatrix<std::complex<double>_>::operator()
                              (&this_02->super_TPZFMatrix<std::complex<double>_>,local_128,uVar17);
          uVar9 = *(undefined8 *)(pcVar18->_M_value + 8);
          *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar18->_M_value;
          *(undefined8 *)(pcVar19->_M_value + 8) = uVar9;
        }
        local_128 = local_128 + 1;
      }
    }
    else {
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        for (uVar24 = 0;
            (uVar31 = uVar28, uVar28 != uVar24 &&
            (uVar31 = uVar24,
            (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
            super_TPZVec<long>.fStore[uVar24] !=
            (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.super_TPZVec<long>.
            fStore[uVar17])); uVar24 = uVar24 + 1) {
        }
        if ((int)uVar31 == iVar23) {
          poVar13 = std::operator<<((ostream *)&std::cout,"node not found in node list");
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        pTVar6 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar21 = (long)pTVar6[uVar17].pos;
        iVar12 = pTVar6[uVar17].dim;
        iVar4 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                [uVar31 & 0xffffffff].pos;
        lVar34 = local_128;
        for (lVar26 = lVar32; lVar33 = lVar21, col = (long)iVar4, lVar26 < lVar25;
            lVar26 = lVar26 + 1) {
          for (; lVar33 < iVar12 + lVar21; lVar33 = lVar33 + 1) {
            pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                (&(this->fMat).super_TPZFMatrix<std::complex<double>_>,lVar26,lVar33
                                );
            pcVar19 = TPZFMatrix<std::complex<double>_>::operator()
                                (&this_02->super_TPZFMatrix<std::complex<double>_>,lVar34,col);
            uVar9 = *(undefined8 *)(pcVar18->_M_value + 8);
            *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar18->_M_value;
            *(undefined8 *)(pcVar19->_M_value + 8) = uVar9;
            col = col + 1;
          }
          lVar34 = lVar34 + 1;
        }
      }
    }
  }
  uVar16 = 0;
  if ((long)local_150 < 1) {
    local_150 = uVar16;
  }
  local_12c = 0;
  do {
    if (iVar23 <= (int)uVar16) {
      TPZVec<int>::~TPZVec(&DependenceOrder);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&connectlist._M_t);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&origlist._M_t);
      return;
    }
    for (uVar22 = 0; uVar22 != uVar28; uVar22 = uVar22 + 1) {
      pTVar15 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                            super_TPZChunkVector<TPZConnect,_10>,
                           (this->super_TPZElementMatrix).fConstrConnect.
                           super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar22]);
      if (DependenceOrder.fStore[uVar22] == local_12c) {
        uVar16 = (ulong)((int)uVar16 + 1);
        pTVar6 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar32 = (long)pTVar6[uVar22].pos;
        lVar25 = pTVar6[uVar22].dim + lVar32;
        ppTVar27 = &pTVar15->fDependList;
        while (pTVar7 = *ppTVar27, pTVar7 != (TPZDepend *)0x0) {
          for (uVar17 = 0; uVar24 = uVar35 & 0xffffffff, (uVar35 & 0xffffffff) != uVar17;
              uVar17 = uVar17 + 1) {
            if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                super_TPZVec<long>.fStore[uVar17] == pTVar7->fDepConnectIndex) {
              uVar24 = uVar17;
              if (iVar23 != (int)uVar17) goto LAB_01058d35;
              break;
            }
          }
          poVar13 = std::operator<<((ostream *)&std::cout,"node not found in node list");
          std::endl<char,std::char_traits<char>>(poVar13);
LAB_01058d35:
          pTVar6 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
          lVar21 = (long)pTVar6[uVar24 & 0xffffffff].pos;
          uVar17 = (ulong)(pTVar15->field_2).fCompose.fNState;
          lVar34 = pTVar6[uVar24 & 0xffffffff].dim + lVar21;
          for (lVar26 = lVar32; lVar26 < lVar25; lVar26 = lVar26 + uVar17) {
            for (lVar33 = lVar21; lVar33 < lVar34; lVar33 = lVar33 + uVar17) {
              pdVar20 = TPZFMatrix<double>::operator()
                                  (&(pTVar7->fDepMatrix).super_TPZFMatrix<double>,
                                   (lVar26 - lVar32) / (long)uVar17,(lVar33 - lVar21) / (long)uVar17
                                  );
              dVar2 = *pdVar20;
              if ((this->super_TPZElementMatrix).fType == EK) {
                for (uVar24 = 0; uVar24 != local_150; uVar24 = uVar24 + 1) {
                  for (uVar31 = 0; uVar17 != uVar31; uVar31 = uVar31 + 1) {
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,
                                         lVar26 + uVar31,uVar24);
                    dVar10 = *(double *)pcVar18->_M_value;
                    dVar11 = *(double *)(pcVar18->_M_value + 8);
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,
                                         uVar31 + lVar33,uVar24);
                    dVar8 = *(double *)(pcVar18->_M_value + 8);
                    *(double *)pcVar18->_M_value = *(double *)pcVar18->_M_value + dVar10 * dVar2;
                    *(double *)(pcVar18->_M_value + 8) = dVar8 + dVar11 * dVar2;
                  }
                }
              }
              else {
                for (uVar24 = 0; uVar24 != uVar30; uVar24 = uVar24 + 1) {
                  for (uVar31 = 0; uVar17 != uVar31; uVar31 = uVar31 + 1) {
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,
                                         lVar26 + uVar31,uVar24);
                    dVar10 = *(double *)pcVar18->_M_value;
                    dVar11 = *(double *)(pcVar18->_M_value + 8);
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,
                                         uVar31 + lVar33,uVar24);
                    dVar8 = *(double *)(pcVar18->_M_value + 8);
                    *(double *)pcVar18->_M_value = *(double *)pcVar18->_M_value + dVar10 * dVar2;
                    *(double *)(pcVar18->_M_value + 8) = dVar8 + dVar11 * dVar2;
                  }
                }
              }
            }
          }
          lVar26 = lVar32;
          if ((this->super_TPZElementMatrix).fType == EK) {
            for (; lVar26 < lVar25; lVar26 = lVar26 + uVar17) {
              for (lVar33 = lVar21; lVar33 < lVar34; lVar33 = lVar33 + uVar17) {
                pdVar20 = TPZFMatrix<double>::operator()
                                    (&(pTVar7->fDepMatrix).super_TPZFMatrix<double>,
                                     (lVar26 - lVar32) / (long)uVar17,
                                     (lVar33 - lVar21) / (long)uVar17);
                dVar2 = *pdVar20;
                for (uVar24 = 0; uVar24 != local_150; uVar24 = uVar24 + 1) {
                  for (uVar31 = 0; uVar17 != uVar31; uVar31 = uVar31 + 1) {
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,uVar24,
                                         lVar26 + uVar31);
                    dVar10 = *(double *)pcVar18->_M_value;
                    dVar11 = *(double *)(pcVar18->_M_value + 8);
                    pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                        (&this_02->super_TPZFMatrix<std::complex<double>_>,uVar24,
                                         uVar31 + lVar33);
                    dVar8 = *(double *)(pcVar18->_M_value + 8);
                    *(double *)pcVar18->_M_value = *(double *)pcVar18->_M_value + dVar10 * dVar2;
                    *(double *)(pcVar18->_M_value + 8) = dVar8 + dVar11 * dVar2;
                  }
                }
              }
            }
          }
          ppTVar27 = &pTVar7->fNext;
        }
        if ((this->super_TPZElementMatrix).fOneRestraints.
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node._M_size != 0) {
          (*(this->super_TPZElementMatrix)._vptr_TPZElementMatrix[7])(this,uVar22 & 0xffffffff);
        }
      }
    }
    local_12c = local_12c + 1;
  } while( true );
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyConstraints(){
	
	if (this->fMat.Rows() == 0){
		LOGPZ_FATAL(logger, "this->fMat not initialized");
	}
	
	int totalnodes= this->NConnects();
	this->fConstrConnect.Resize(totalnodes);
	if(totalnodes) this->fConstrConnect.Fill(0,0);
	int in;
    std::set<int64_t> origlist,connectlist;
	for(in=0; in<totalnodes; in++) connectlist.insert(this->fConnect[in]);
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        for (int c=0; c< it->fFaces.size(); c++) {
            connectlist.insert(it->fFaces[c].first);
        }
    }
    origlist = connectlist;
	// total number of nodes of the constrained element
	TPZConnect::BuildConnectList(connectlist, origlist, *this->fMesh);
    this->fConstrConnect.resize(connectlist.size());
    std::set<int64_t>::iterator it = connectlist.begin();
    for (int64_t i=0; i<connectlist.size(); i++) {
        fConstrConnect[i] = *it;
        it++;
    }
	totalnodes = this->fConstrConnect.NElements();
	
	// compute the list of nodes and their proper order of processing
	TPZVec<int> DependenceOrder;
	// this->fConstrNod, totalnodes and DependenceOrder
	// are initialized using codes documented above
	BuildDependencyOrder(this->fConstrConnect,DependenceOrder,*this->fMesh);
	
	// compute the number of statevariables
	// the number of state variables is the number of unknowns associated with
	// each shapefunction
	// numstate is best initialized during computation of the stiffness matrix
	//   TPZMaterial * mat = Material();
	//   int numstate = mat->NStateVariables();
	
	// initialize the block structure
	this->fConstrBlock.SetNBlocks(totalnodes);
	
	// toteq contains the total number of equations of the constrained matrix
	int64_t toteq = 0;
	for(in=0; in<totalnodes; in++) {
		int64_t dfnindex = this->fConstrConnect[in];
		TPZConnect &dfn = fMesh->ConnectVec()[dfnindex];
		int ndf = dfn.NDof(*fMesh);
        int ndfcheck = dfn.NState()*dfn.NShape();
        if(ndf != ndfcheck)
        {
            DebugStop();
        }
		this->fConstrBlock.Set(in,ndf);
		toteq += ndf;
	}
	
	this->fConstrBlock.Resequence();
	this->fConstrBlock.SetMatrix(&this->fConstrMat);
	    
	int64_t nrhs = this->fMat.Cols();
	if (this->fType == TPZElementMatrix::EK){
		this->fConstrMat.Redim(toteq,toteq);
	}
	else{
		this->fConstrMat.Redim(toteq,nrhs);
	}
	
	// copy the original matrix to the constrained matrix
	int numnod = this->fConnect.NElements();
	for(in=0; in<numnod; in++) {
		int irnode =0;
		int64_t idfn = this->fConnect[in];
		// find the index of the node in the destination (constrained) matrix
		while(irnode < totalnodes && this->fConstrConnect[irnode] != idfn) irnode++;
		
		// first and last rows in the original matrix
		int64_t ifirst = this->fBlock.Position(in);
		int64_t ilast = ifirst+this->fBlock.Size(in);
		
		// first and last rows in the desination (reception) matrix
		int64_t irfirst = this->fConstrBlock.Position(irnode);
		//	   int irlast = irfirst+this->fConstrBlock->Size(irnode);
		
		int64_t i,ir,ieq;
		if (this->fType == TPZElementMatrix::EF){
			for(i=ifirst,ir=irfirst;i<ilast;i++,ir++) {
				for(ieq=0; ieq<nrhs; ieq++) {
					(this->fConstrMat)(ir,ieq) = (this->fMat)(i,ieq);
				}
			}
		}
		else{
			int jn;
			for(jn=0; jn<numnod; jn++) {
				int jrnode = 0;
				int64_t jdfn = this->fConnect[jn];
				// find the index of the node in the destination (constrained) matrix
				while(jrnode < totalnodes && this->fConstrConnect[jrnode] != jdfn) jrnode++;
				if(jrnode == totalnodes) {
					LOGPZ_ERROR(logger, "node not found in node list");
				}
				// first and last columns in the original matrix
				int64_t jfirst = this->fBlock.Position(jn);
				int64_t jlast = jfirst+this->fBlock.Size(jn);
				// first and last columns in the desination (reception) matrix
				int64_t jrfirst = this->fConstrBlock.Position(jrnode);
				//int jrlast = irfirst+this->fConstrBlock->Size(jrnode);
				int64_t j,jr;
				for(i=ifirst,ir=irfirst;i<ilast; i++,ir++) {
					for(j=jfirst,jr=jrfirst;j<jlast; j++,jr++) {
						(this->fConstrMat)(ir,jr) = (this->fMat)(i,j);
					}
				}
			}
		}//else
	}
	
	int numnodes_processed = 0;
	int current_order = 0;
	while(numnodes_processed < totalnodes) {
		int in;
		for(in=0; in<totalnodes; in++) {
			int64_t dfnindex = this->fConstrConnect[in];
			TPZConnect *dfn = &(fMesh->ConnectVec()[dfnindex]);
			if(DependenceOrder[in] != current_order) continue;
			
			// only nodes which have dependency order equal to the
			// current order are processed
			numnodes_processed++;
			
			int64_t inpos = this->fConstrBlock.Position(in);
			int64_t insize = this->fConstrBlock.Size(in);
			// inpos : position of the dependent equation
			// insize : number of equations processed
			
			// loop over the nodes from which dfn depends
			TPZConnect::TPZDepend *dep = dfn->FirstDepend();
			while(dep) {
				int64_t depnodeindex = dep->fDepConnectIndex;
				// look for the index where depnode is found
				int depindex=0;
				while(depindex < totalnodes && this->fConstrConnect[depindex] != depnodeindex) depindex++;
				if(depindex == totalnodes) {
					LOGPZ_ERROR(logger,"node not found in node list");
				}
				
				int64_t deppos = this->fConstrBlock.Position(depindex);
				int64_t depsize = this->fConstrBlock.Size(depindex);
				// deppos : position of the receiving equation
				// depsize : number of receiving equations
				
				// process the rows of the constrained matrix
				int64_t send;
				int64_t receive;
				int ieq;
				STATE coef;
				int idf;
				int numstate = dfn->NState();
				for(send=inpos; send<inpos+insize; send += numstate) {
					for(receive=deppos; receive<deppos+depsize; receive += numstate) {
						coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
						if (this->fType == TPZElementMatrix::EK){
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++)  {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EK
						else{
							for(ieq=0; ieq<nrhs; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EF
					}
				}
				
				if (this->fType == TPZElementMatrix::EK){
					for(send=inpos; send<inpos+insize; send += numstate) {
						for(receive=deppos; receive<deppos+depsize; receive += numstate) {
							coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(ieq,receive+idf) += coef*(this->fConstrMat)(ieq,send+idf);
							}
						}
					}
				}//EK
				
				dep = dep->fNext;
			} // end of while
            
            /// check whether the connect has a one shape restraint
            if (fOneRestraints.size())
            {
                ApplyOneShapeConstraints(in);
            }
            
            
		} // end of loop over all nodes
		current_order++;
	} // end of while loop
}